

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentwriter.cpp
# Opt level: O2

void __thiscall
QTextDocumentWriter::QTextDocumentWriter
          (QTextDocumentWriter *this,QIODevice *device,QByteArray *format)

{
  QTextDocumentWriterPrivate *this_00;
  
  this_00 = (QTextDocumentWriterPrivate *)operator_new(0x30);
  (this_00->format).d.d = (Data *)0x0;
  (this_00->format).d.ptr = (char *)0x0;
  (this_00->format).d.size = 0;
  this_00->device = (QIODevice *)0x0;
  this_00->deleteDevice = false;
  this_00->q = this;
  this->d = this_00;
  this_00->device = device;
  QByteArray::operator=((QByteArray *)this_00,format);
  return;
}

Assistant:

QTextDocumentWriter::QTextDocumentWriter(QIODevice *device, const QByteArray &format)
    : d(new QTextDocumentWriterPrivate(this))
{
    d->device = device;
    d->format = format;
}